

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O2

FILE * open_obj_file(char *filename)

{
  FILE *__s;
  uint32_t i;
  int iVar1;
  
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    printf("could not open file \'%s\' for write - aborting!",filename);
  }
  else {
    printf("writing file %s\n",filename);
    fwrite("vn 1 0 0\n",9,1,__s);
    fwrite("vn -1 0 0\n",10,1,__s);
    fwrite("vn 0 1 0\n",9,1,__s);
    fwrite("vn 0 -1 0\n",10,1,__s);
    fwrite("vn 0 0 1\n",9,1,__s);
    fwrite("vn 0 0 -1\n",10,1,__s);
    for (iVar1 = 0; iVar1 != 0x100; iVar1 = iVar1 + 1) {
      fprintf(__s,"vt %f 0.5\n",(double)(((float)iVar1 + 0.5) * 0.00390625));
    }
  }
  return (FILE *)__s;
}

Assistant:

FILE* open_obj_file(const char* filename)
{
    FILE * fout = open_file(filename, "wb");
    if (!fout) {
        printf("could not open file '%s' for write - aborting!", filename);
        return nullptr;
    }
    printf("writing file %s\n", filename);
    // there will only ever be 6 normals, so write them out only once.
    fprintf(fout, "vn 1 0 0\n");
    fprintf(fout, "vn -1 0 0\n");
    fprintf(fout, "vn 0 1 0\n");
    fprintf(fout, "vn 0 -1 0\n");
    fprintf(fout, "vn 0 0 1\n");
    fprintf(fout, "vn 0 0 -1\n");

    // there will only ever be up to 256 texcoords, so write them out only once
    for (uint32_t i = 0; i < 256; i++) {
        float u = (0.5f + (float)i) * (1.0f / 256.0f);
        fprintf(fout, "vt %f 0.5\n", u);
    }
    return fout;
}